

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::anon_unknown_39::findThisHandle
          (anon_unknown_39 *this,Scope *scope,bitmask<slang::ast::LookupFlags> flags,
          SourceRange range,LookupResult *result)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  anon_unknown_39 *paVar4;
  Symbol *pSVar5;
  undefined4 in_register_00000014;
  SourceRange range_00;
  
  range_00.startLoc._4_4_ = in_register_00000014;
  range_00.startLoc._0_4_ = flags.m_bits;
  paVar4 = this;
  if (((uint)scope >> 0xc & 1) == 0) {
    do {
      puVar2 = *(uint **)(paVar4 + 8);
      uVar1 = *puVar2;
      pSVar5 = (Symbol *)(ulong)uVar1;
      if ((int)uVar1 < 0x40) {
        if (uVar1 != 0x3a) {
          if ((uVar1 != 0x16) || (((uint)scope >> 0xb & 1) != 0)) goto LAB_00334f73;
          pSVar5 = *(Symbol **)(puVar2 + 0x22);
          goto LAB_00334f6f;
        }
      }
      else if (uVar1 != 0x59) goto LAB_00334f3f;
      paVar4 = *(anon_unknown_39 **)(puVar2 + 8);
    } while( true );
  }
  for (pSVar5 = *(Symbol **)(this + 8);
      ((pSVar5->kind != ClassType && (pSVar5->kind != InstanceBody)) &&
      (pSVar5->parentScope != (Scope *)0x0)); pSVar5 = pSVar5->parentScope->thisSym) {
  }
  if (pSVar5->kind == ClassType) {
    return pSVar5;
  }
  goto LAB_00334f79;
LAB_00334f3f:
  if (uVar1 == 0x40) {
    pSVar5 = *(Symbol **)(puVar2 + 0x36);
LAB_00334f6a:
    if (pSVar5 == (Symbol *)0x0) goto LAB_00334f73;
LAB_00334f6f:
    bVar3 = false;
  }
  else {
    if (uVar1 == 0x48) {
      pSVar5 = *(Symbol **)(puVar2 + 0x1e);
      goto LAB_00334f6a;
    }
LAB_00334f73:
    bVar3 = true;
  }
  if (!bVar3) {
    return pSVar5;
  }
LAB_00334f79:
  range_00.endLoc = range.startLoc;
  Diagnostics::add((Diagnostics *)((long)range.endLoc + 0x148),*(Symbol **)(this + 8),
                   (DiagCode)0x16000a,range_00);
  return (Symbol *)0x0;
}

Assistant:

const Symbol* findThisHandle(const Scope& scope, bitmask<LookupFlags> flags, SourceRange range,
                             LookupResult& result) {
    if (flags.has(LookupFlags::TypeReference)) {
        // type(this) is allowed to work anywhere within a class, regardless of whether
        // it's a static context or not.
        auto parent = &scope.asSymbol();
        while (parent->kind != SymbolKind::ClassType && parent->kind != SymbolKind::InstanceBody) {
            auto parentScope = parent->getParentScope();
            if (!parentScope)
                break;
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::ClassType)
            return &parent->as<ClassType>();
    }
    else {
        // Find the parent method, if we can.
        const Symbol* parent = &scope.asSymbol();
        while (parent->kind == SymbolKind::StatementBlock ||
               parent->kind == SymbolKind::RandSeqProduction) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::Subroutine) {
            auto& sub = parent->as<SubroutineSymbol>();
            if (sub.thisVar)
                return sub.thisVar;
        }
        else if (parent->kind == SymbolKind::ConstraintBlock) {
            auto thisVar = parent->as<ConstraintBlockSymbol>().thisVar;
            if (thisVar)
                return thisVar;
        }
        else if (parent->kind == SymbolKind::ClassType &&
                 !flags.has(LookupFlags::StaticInitializer)) {
            return parent->as<ClassType>().thisVar;
        }
    }

    result.addDiag(scope, diag::InvalidThisHandle, range);
    return nullptr;
}